

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::Version::LevelFileNumIterator::LevelFileNumIterator
          (LevelFileNumIterator *this,InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *flist)

{
  size_type sVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *flist_local;
  InternalKeyComparator *icmp_local;
  LevelFileNumIterator *this_local;
  
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_0014f2d0;
  InternalKeyComparator::InternalKeyComparator(&this->icmp_,icmp);
  this->flist_ = flist;
  sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (flist);
  this->index_ = (uint32_t)sVar1;
  return;
}

Assistant:

LevelFileNumIterator(const InternalKeyComparator& icmp,
                       const std::vector<FileMetaData*>* flist)
      : icmp_(icmp), flist_(flist), index_(flist->size()) {  // Marks as invalid
  }